

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_2cc340::HandleChmodCommandImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool recurse,cmExecutionStatus *status)

{
  bool *this;
  pointer *ppbVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  int iVar4;
  cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
  *pcVar5;
  cmArgumentParser<Arguments> *pcVar6;
  cmMakefile *mf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  iterator __first;
  iterator __last;
  static_string_view sVar7;
  mode_t *local_498;
  mode_t *local_488;
  bool local_443;
  mode_t *directoryPermissions;
  bool success_1;
  mode_t *filePermissions;
  undefined1 local_398 [7];
  bool success;
  cmAlphaNum local_368;
  string local_338;
  string *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_1;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e0;
  const_iterator local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tempPathEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allPathEntries;
  undefined1 local_258 [6];
  bool validatePermissions;
  undefined4 local_238;
  allocator<char> local_231;
  string local_230;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_210;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_200;
  undefined1 local_1f0 [8];
  Arguments parsedArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathEntries;
  cmArgumentParser<Arguments> local_108;
  undefined1 local_90 [8];
  Glob globber;
  mode_t local_30;
  mode_t dperms;
  mode_t fperms;
  mode_t perms;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool recurse_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  dperms = 0;
  local_30 = 0;
  globber._84_4_ = 0;
  _fperms = status;
  status_local._7_1_ = recurse;
  pvStack_18 = args;
  cmsys::Glob::Glob((Glob *)local_90);
  cmsys::Glob::SetRecurse((Glob *)local_90,(bool)(status_local._7_1_ & 1));
  cmsys::Glob::SetRecurseListDirs((Glob *)local_90,(bool)(status_local._7_1_ & 1));
  if (((anonymous_namespace)::
       HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_108.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
    local_108.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
    local_108.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0
    ;
    local_108.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
    local_108.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object
         = (void *)0x0;
    local_108.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
    local_108.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
         (_Manager_type)0x0;
    local_108.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
    _M_object = (void *)0x0;
    local_108.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmArgumentParser<Arguments>::cmArgumentParser(&local_108);
    sVar7 = ::cm::operator____s("PERMISSIONS",0xb);
    pcVar5 = (cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
                ::
                Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                          ((cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
                            *)&local_108,sVar7,0x30);
    sVar7 = ::cm::operator____s("FILE_PERMISSIONS",0x10);
    pcVar5 = (cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
              *)cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
                ::
                Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                          (pcVar5,sVar7,0x50);
    sVar7 = ::cm::operator____s("DIRECTORY_PERMISSIONS",0x15);
    pcVar6 = cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
             ::
             Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                       (pcVar5,sVar7,0x70);
    cmArgumentParser<Arguments>::cmArgumentParser(&HandleChmodCommandImpl::parser,pcVar6);
    cmArgumentParser<Arguments>::~cmArgumentParser(&local_108);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleChmodCommandImpl::parser,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)
                         ::parser);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&parsedArgs.DirectoryPermissions.
               super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_engaged);
  local_210 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        (pvStack_18);
  local_200 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance(&local_210,1);
  cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
  ::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Arguments *)local_1f0,
             (cmArgumentParser<(anonymous_namespace)::HandleChmodCommandImpl(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool,cmExecutionStatus&)::Arguments>
              *)&HandleChmodCommandImpl::parser,&local_200,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parsedArgs.DirectoryPermissions.
                 super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_engaged,0);
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
  if (!bVar3) {
    bVar3 = std::optional::operator_cast_to_bool
                      ((optional *)
                       &parsedArgs.Permissions.
                        super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_engaged);
    if (!bVar3) {
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &parsedArgs.FilePermissions.
                          super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_engaged);
      pcVar2 = _fperms;
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"No permissions given",&local_231);
        cmExecutionStatus::SetError(pcVar2,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::allocator<char>::~allocator(&local_231);
        cmSystemTools::SetFatalErrorOccurred();
        args_local._7_1_ = 0;
        local_238 = 1;
        goto LAB_0029329d;
      }
    }
  }
  bVar3 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
  if (bVar3) {
    bVar3 = std::optional::operator_cast_to_bool
                      ((optional *)
                       &parsedArgs.Permissions.
                        super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_engaged);
    if (bVar3) {
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &parsedArgs.FilePermissions.
                          super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_engaged);
      pcVar2 = _fperms;
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_258,
                   "Remove either PERMISSIONS or FILE_PERMISSIONS or DIRECTORY_PERMISSIONS from the invocation"
                   ,(allocator<char> *)
                    ((long)&allPathEntries.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmExecutionStatus::SetError(pcVar2,(string *)local_258);
        std::__cxx11::string::~string((string *)local_258);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&allPathEntries.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmSystemTools::SetFatalErrorOccurred();
        args_local._7_1_ = 0;
        local_238 = 1;
        goto LAB_0029329d;
      }
    }
  }
  mf = cmExecutionStatus::GetMakefile(_fperms);
  bVar3 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_1f0,mf);
  if (bVar3) {
    cmSystemTools::SetFatalErrorOccurred();
    args_local._7_1_ = 1;
    local_238 = 1;
  }
  else {
    bVar3 = ValidateAndConvertPermissions
                      ((optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.
                           super__Rb_tree_header._M_node_count,&dperms,_fperms);
    local_443 = false;
    if (bVar3) {
      bVar3 = ValidateAndConvertPermissions
                        ((optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&parsedArgs.Permissions.
                             super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_engaged,&local_30,_fperms);
      local_443 = false;
      if (bVar3) {
        local_443 = ValidateAndConvertPermissions
                              ((optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&parsedArgs.FilePermissions.
                                   super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_engaged,(mode_t *)&globber.field_0x54,_fperms);
      }
    }
    allPathEntries.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = local_443;
    if (local_443 == false) {
      args_local._7_1_ = 0;
      local_238 = 1;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&tempPathEntries.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((status_local._7_1_ & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tempPathEntries.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&parsedArgs.DirectoryPermissions.
                        super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_engaged);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
        this = &parsedArgs.DirectoryPermissions.
                super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_engaged;
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this);
        i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&i);
          if (!bVar3) break;
          local_2b0 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end2);
          bVar3 = cmsys::SystemTools::FileIsDirectory(local_2b0);
          if (bVar3) {
            std::operator+(&local_2d0,local_2b0,"/*");
            cmsys::Glob::FindFiles((Glob *)local_90,&local_2d0,(GlobMessages *)0x0);
            std::__cxx11::string::~string((string *)&local_2d0);
            __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_90);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range2,__x);
            ppbVar1 = &tempPathEntries.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_2e0._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)ppbVar1);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_2d8,&local_2e0);
            __first = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&__range2);
            __last = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range2);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)ppbVar1,
                       local_2d8,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__first._M_current,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__last._M_current);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &tempPathEntries.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_2b0);
          }
          else {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &tempPathEntries.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_2b0);
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2);
      }
      ppbVar1 = &tempPathEntries.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)ppbVar1);
      i_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)ppbVar1);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&i_1);
        if (!bVar3) break;
        local_318 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
        bVar3 = cmsys::SystemTools::FileExists(local_318);
        if (!bVar3) {
          bVar3 = cmsys::SystemTools::FileIsDirectory(local_318);
          pcVar2 = _fperms;
          if (!bVar3) {
            cmAlphaNum::cmAlphaNum(&local_368,"does not exist:\n  ");
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_398,local_318);
            cmStrCat<>(&local_338,&local_368,(cmAlphaNum *)local_398);
            cmExecutionStatus::SetError(pcVar2,&local_338);
            std::__cxx11::string::~string((string *)&local_338);
            cmSystemTools::SetFatalErrorOccurred();
            args_local._7_1_ = 0;
            goto LAB_00293281;
          }
        }
        bVar3 = cmsys::SystemTools::FileExists(local_318,true);
        if (bVar3) {
          filePermissions._7_1_ = true;
          bVar3 = std::optional::operator_cast_to_bool
                            ((optional *)
                             &parsedArgs.Permissions.
                              super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_engaged);
          if (bVar3) {
            local_488 = &local_30;
          }
          else {
            local_488 = &dperms;
          }
          if (*local_488 != 0) {
            filePermissions._7_1_ = SetPermissions(local_318,local_488,_fperms);
          }
          if (filePermissions._7_1_ == false) {
            args_local._7_1_ = 0;
            goto LAB_00293281;
          }
        }
        else {
          bVar3 = cmsys::SystemTools::FileIsDirectory(local_318);
          if (bVar3) {
            directoryPermissions._7_1_ = true;
            bVar3 = std::optional::operator_cast_to_bool
                              ((optional *)
                               &parsedArgs.FilePermissions.
                                super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_engaged);
            if (bVar3) {
              local_498 = (mode_t *)&globber.field_0x54;
            }
            else {
              local_498 = &dperms;
            }
            if (*local_498 != 0) {
              directoryPermissions._7_1_ = SetPermissions(local_318,local_498,_fperms);
            }
            if (directoryPermissions._7_1_ == false) {
              args_local._7_1_ = 0;
              goto LAB_00293281;
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      args_local._7_1_ = 1;
LAB_00293281:
      local_238 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&tempPathEntries.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
LAB_0029329d:
  HandleChmodCommandImpl::Arguments::~Arguments((Arguments *)local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&parsedArgs.DirectoryPermissions.
                super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_engaged);
  cmsys::Glob::~Glob((Glob *)local_90);
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleChmodCommandImpl(std::vector<std::string> const& args, bool recurse,
                            cmExecutionStatus& status)
{
  mode_t perms = 0;
  mode_t fperms = 0;
  mode_t dperms = 0;
  cmsys::Glob globber;

  globber.SetRecurse(recurse);
  globber.SetRecurseListDirs(recurse);

  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::vector<std::string>>>
      Permissions;
    cm::optional<ArgumentParser::NonEmpty<std::vector<std::string>>>
      FilePermissions;
    cm::optional<ArgumentParser::NonEmpty<std::vector<std::string>>>
      DirectoryPermissions;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("PERMISSIONS"_s, &Arguments::Permissions)
      .Bind("FILE_PERMISSIONS"_s, &Arguments::FilePermissions)
      .Bind("DIRECTORY_PERMISSIONS"_s, &Arguments::DirectoryPermissions);

  std::vector<std::string> pathEntries;
  Arguments parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &pathEntries);

  // check validity of arguments
  if (!parsedArgs.Permissions && !parsedArgs.FilePermissions &&
      !parsedArgs.DirectoryPermissions) // no permissions given
  {
    status.SetError("No permissions given");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.Permissions && parsedArgs.FilePermissions &&
      parsedArgs.DirectoryPermissions) // all keywords are used
  {
    status.SetError("Remove either PERMISSIONS or FILE_PERMISSIONS or "
                    "DIRECTORY_PERMISSIONS from the invocation");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  // validate permissions
  bool validatePermissions =
    ValidateAndConvertPermissions(parsedArgs.Permissions, perms, status) &&
    ValidateAndConvertPermissions(parsedArgs.FilePermissions, fperms,
                                  status) &&
    ValidateAndConvertPermissions(parsedArgs.DirectoryPermissions, dperms,
                                  status);
  if (!validatePermissions) {
    return false;
  }

  std::vector<std::string> allPathEntries;

  if (recurse) {
    std::vector<std::string> tempPathEntries;
    for (const auto& i : pathEntries) {
      if (cmSystemTools::FileIsDirectory(i)) {
        globber.FindFiles(i + "/*");
        tempPathEntries = globber.GetFiles();
        allPathEntries.insert(allPathEntries.end(), tempPathEntries.begin(),
                              tempPathEntries.end());
        allPathEntries.emplace_back(i);
      } else {
        allPathEntries.emplace_back(i); // We validate path entries below
      }
    }
  } else {
    allPathEntries = std::move(pathEntries);
  }

  // chmod
  for (const auto& i : allPathEntries) {
    if (!(cmSystemTools::FileExists(i) || cmSystemTools::FileIsDirectory(i))) {
      status.SetError(cmStrCat("does not exist:\n  ", i));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }

    if (cmSystemTools::FileExists(i, true)) {
      bool success = true;
      const mode_t& filePermissions =
        parsedArgs.FilePermissions ? fperms : perms;
      if (filePermissions) {
        success = SetPermissions(i, filePermissions, status);
      }
      if (!success) {
        return false;
      }
    }

    else if (cmSystemTools::FileIsDirectory(i)) {
      bool success = true;
      const mode_t& directoryPermissions =
        parsedArgs.DirectoryPermissions ? dperms : perms;
      if (directoryPermissions) {
        success = SetPermissions(i, directoryPermissions, status);
      }
      if (!success) {
        return false;
      }
    }
  }

  return true;
}